

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

void test_multiple_semaphores_waiting(void)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  shared_ptr<TestCase> *test_case_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *__range2;
  uint time_us;
  int max_step_size;
  int min_step_size;
  shared_ptr<TestCase> *test_case;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *__range1;
  uint unlocked_after;
  uint timeout;
  int i;
  int num_additional_threads;
  vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> test_cases;
  LockstepScheduler ls;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  int iVar4;
  TestCase *in_stack_fffffffffffffea0;
  __normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
  local_150;
  LockstepScheduler *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint uVar5;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  __normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
  in_stack_fffffffffffffee0;
  int local_f8;
  uint64_t in_stack_ffffffffffffff18;
  LockstepScheduler *in_stack_ffffffffffffff20;
  
  LockstepScheduler::LockstepScheduler((LockstepScheduler *)in_stack_fffffffffffffea0);
  LockstepScheduler::set_absolute_time(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::vector
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             0x10f91e);
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::push_back
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<TestCase>::~shared_ptr((shared_ptr<TestCase> *)0x10f97f);
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::push_back
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<TestCase>::~shared_ptr((shared_ptr<TestCase> *)0x10f9e0);
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::push_back
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<TestCase>::~shared_ptr((shared_ptr<TestCase> *)0x10fa41);
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::push_back
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<TestCase>::~shared_ptr((shared_ptr<TestCase> *)0x10faa2);
  std::make_shared<TestCase,int,int,LockstepScheduler&>
            ((int *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::push_back
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<TestCase>::~shared_ptr((shared_ptr<TestCase> *)0x10fb03);
  iVar2 = random_number((int)((ulong)in_stack_fffffffffffffee0._M_current >> 0x20),
                        (int)in_stack_fffffffffffffee0._M_current);
  iVar4 = iVar2;
  for (local_f8 = 0; local_f8 < iVar2; local_f8 = local_f8 + 1) {
    in_stack_fffffffffffffe90 =
         random_number((int)((ulong)in_stack_fffffffffffffee0._M_current >> 0x20),
                       (int)in_stack_fffffffffffffee0._M_current);
    in_stack_fffffffffffffe8c =
         random_number((int)((ulong)in_stack_fffffffffffffee0._M_current >> 0x20),
                       (int)in_stack_fffffffffffffee0._M_current);
    std::make_shared<TestCase,unsigned_int_const&,unsigned_int_const&,LockstepScheduler&>
              ((uint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (uint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::push_back
              ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
               CONCAT44(iVar4,in_stack_fffffffffffffe90),
               (value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::shared_ptr<TestCase>::~shared_ptr((shared_ptr<TestCase> *)0x10fbb8);
  }
  iVar3 = std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::begin
                    ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::end
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
                        *)CONCAT44(iVar4,in_stack_fffffffffffffe90),
                       (__normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
                 *)&stack0xfffffffffffffee0);
    std::__shared_ptr_access<TestCase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TestCase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10fd3a);
    TestCase::run(in_stack_fffffffffffffea0);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
                  *)&stack0xfffffffffffffee0);
  }
  for (uVar5 = 1; uVar5 < 0x4e85; uVar5 = in_stack_fffffffffffffe88 + uVar5) {
    LockstepScheduler::set_absolute_time(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_150._M_current =
         (shared_ptr<TestCase> *)
         std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::begin
                   ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>
                     *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::end
              ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
                          *)CONCAT44(iVar4,in_stack_fffffffffffffe90),
                         (__normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (!bVar1) break;
      in_stack_fffffffffffffea0 =
           (TestCase *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
           ::operator*(&local_150);
      std::__shared_ptr_access<TestCase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<TestCase,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10fded
                );
      TestCase::check(in_stack_fffffffffffffea0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<TestCase>_*,_std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>_>
      ::operator++(&local_150);
    }
    in_stack_fffffffffffffe88 =
         random_number((int)((ulong)iVar3._M_current >> 0x20),(int)iVar3._M_current);
  }
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::clear
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             0x10fe38);
  std::vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_>::~vector
            ((vector<std::shared_ptr<TestCase>,_std::allocator<std::shared_ptr<TestCase>_>_> *)
             in_stack_fffffffffffffea0);
  LockstepScheduler::~LockstepScheduler((LockstepScheduler *)0x10fe52);
  return;
}

Assistant:

void test_multiple_semaphores_waiting()
{

    LockstepScheduler ls;
    ls.set_absolute_time(some_time_us);

    // Use different timeouts in random order.
    std::vector<std::shared_ptr<TestCase>> test_cases{};

    test_cases.push_back(
        std::make_shared<TestCase>(
            11111, 11111, ls));

    test_cases.push_back(
        std::make_shared<TestCase>(
            20000, 20000, ls));

    test_cases.push_back(
        std::make_shared<TestCase>(
            0, 20000, ls));

    test_cases.push_back(
        std::make_shared<TestCase>(
            20000, 10000, ls));

    test_cases.push_back(
        std::make_shared<TestCase>(
            0, 0, ls));

    const int num_additional_threads = random_number(1, 20);

    for (int i = 0; i < num_additional_threads; ++i) {
        const unsigned timeout = random_number(1, 20000);
        const unsigned unlocked_after = random_number(1, 20000);
        test_cases.push_back(
            std::make_shared<TestCase>(
                timeout, unlocked_after, ls));
    }

    for (auto &test_case : test_cases) {
        test_case->run();
    }

    const int min_step_size = 1;
    const int max_step_size = 100;

    // We need to go until the max plus max step size to make sure we trigger
    // all timeouts or semaphores.
    for (unsigned time_us = 1;
         time_us <= (20000 + max_step_size);
         time_us += random_number(min_step_size, max_step_size)) {

        ls.set_absolute_time(some_time_us + time_us);

        for (auto &test_case : test_cases) {
            test_case->check();
        }
    }

    test_cases.clear();
}